

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

void __thiscall asl::String::append(String *this,char *b,int n)

{
  int n_00;
  anon_union_16_2_78e7fdac_for_String_2 *paVar1;
  
  n_00 = this->_len + n;
  if (n_00 < this->_size) {
    this->_len = n_00;
  }
  else {
    resize(this,n_00,true,true);
  }
  if (this->_size == 0) {
    paVar1 = &this->field_2;
  }
  else {
    paVar1 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->field_2)._str;
  }
  memcpy((char *)((long)paVar1 + ((long)this->_len - (long)n)),b,(long)n);
  paVar1->_space[this->_len] = '\0';
  return;
}

Assistant:

void String::append(const char* b, int n)
{
	if(_len+n >= _size)
		resize(_len+n);
	else
		_len += n;
	char* s = str();
	memcpy(s+_len-n, b, n);
	s[_len] = '\0';
}